

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O1

idx_t __thiscall
duckdb::BatchedDataCollection::IndexToBatchIndex(BatchedDataCollection *this,idx_t index)

{
  _Rb_tree_node_base *p_Var1;
  InternalException *this_00;
  string local_48;
  
  if ((this->data)._M_t._M_impl.super__Rb_tree_header._M_node_count <= index) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "Index %d is out of range for this collection, it only contains %d batches","");
    InternalException::InternalException<unsigned_long,unsigned_long>
              (this_00,&local_48,index,(this->data)._M_t._M_impl.super__Rb_tree_header._M_node_count
              );
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  p_Var1 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((long)index < 1) {
    if (index != 0) {
      do {
        p_Var1 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var1);
        index = index + 1;
      } while (index != 0);
    }
  }
  else {
    do {
      p_Var1 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var1);
      index = index - 1;
    } while (index != 0);
  }
  return *(idx_t *)(p_Var1 + 1);
}

Assistant:

idx_t BatchedDataCollection::IndexToBatchIndex(idx_t index) const {
	if (index >= data.size()) {
		throw InternalException("Index %d is out of range for this collection, it only contains %d batches", index,
		                        data.size());
	}
	auto entry = data.begin();
	std::advance(entry, index);
	return entry->first;
}